

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::EntityType::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityType *this)

{
  ostream *poVar1;
  allocator<char> local_1e1;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  EntityType *local_18;
  EntityType *this_local;
  
  local_18 = this;
  this_local = (EntityType *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,",",&local_1e1);
  CreateTokenisedString(&local_1c0,this,&local_1e0);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EntityType::GetAsString() const
{
    KStringStream ss;

    ss << CreateTokenisedString() << "\n";

    return ss.str();
}